

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getDualRayInterface(Highs *this,bool *has_dual_ray,double *dual_ray_value)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  HighsInt iRow_2;
  HighsInt *dual_ray_num_nz;
  HighsInt iRow_1;
  vector<double,_std::allocator<double>_> rhs;
  HighsInt iRow;
  HighsStatus call_status;
  HighsHessian zero_hessian;
  HighsStatus status;
  HighsRayRecord primal_ray_record;
  vector<double,_std::allocator<double>_> zero_costs;
  bool is_qp;
  bool solve_feasibility_problem;
  string presolve;
  bool solve_relaxation;
  HighsHessian hessian;
  vector<double,_std::allocator<double>_> col_cost;
  bool has_invert;
  HighsInt num_row;
  HighsLp *lp;
  HighsStatus return_status;
  HighsHessian *in_stack_fffffffffffffc98;
  allocator *paVar4;
  Highs *in_stack_fffffffffffffca0;
  Highs *in_stack_fffffffffffffca8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb0;
  HighsHessian *in_stack_fffffffffffffcb8;
  vector<double,_std::allocator<double>_> *this_00;
  HighsHessian *in_stack_fffffffffffffcc0;
  vector<double,_std::allocator<double>_> *this_01;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  allocator local_2e9;
  string local_2e8 [32];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  Highs *in_stack_fffffffffffffd58;
  int local_29c;
  int local_264;
  HighsStatus local_260;
  string local_258 [15];
  undefined1 in_stack_fffffffffffffdb7;
  double *in_stack_fffffffffffffdb8;
  HighsInt in_stack_fffffffffffffdc0;
  HighsInt in_stack_fffffffffffffdc4;
  Highs *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  Highs *in_stack_fffffffffffffdd8;
  HighsHessian *in_stack_fffffffffffffe20;
  Highs *in_stack_fffffffffffffe28;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  undefined4 local_d8;
  byte local_d2;
  byte local_d1;
  string local_d0 [155];
  byte local_35;
  int local_34;
  long local_30;
  HighsStatus local_24;
  long local_20;
  byte *local_18;
  HighsStatus local_4;
  
  local_24 = kOk;
  local_30 = in_RDI + 0x138;
  local_34 = *(int *)(in_RDI + 0x13c);
  if (local_34 == 0) {
    return kOk;
  }
  local_35 = *(byte *)(in_RDI + 0x3850) & 1;
  *in_RSI = *(int *)(in_RDI + 0x4a40) != -1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4ddf5a);
  HighsHessian::HighsHessian(in_stack_fffffffffffffcc0);
  std::__cxx11::string::string(local_d0);
  local_d1 = 0;
  local_d2 = HighsModel::isQp((HighsModel *)(in_RDI + 0x138));
  if (local_20 != 0) {
    if (((*local_18 & 1) == 0) || ((local_35 & 1) == 0)) {
      if (*(int *)(in_RDI + 0x1244) == 7) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                     "Model status is optimal, so no dual ray is available\n");
        goto LAB_004deab3;
      }
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                   "Solving LP to try to compute dual ray\n");
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      if ((local_d2 & 1) != 0) {
        HighsHessian::operator=((HighsHessian *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
        ;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"presolve",&local_f9);
      getOptionValue(in_stack_fffffffffffffca0,(string *)in_stack_fffffffffffffc98,
                     (string *)0x4de0f5);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"solve_relaxation",&local_121);
      getOptionValue(in_stack_fffffffffffffca0,(string *)in_stack_fffffffffffffc98,(bool *)0x4de158)
      ;
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      local_d1 = 1;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x4de18e);
      std::vector<double,_std::allocator<double>_>::assign
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                 (size_type)in_stack_fffffffffffffc98,(value_type_conflict1 *)0x4de1b7);
      HighsRayRecord::getRayRecord
                ((HighsRayRecord *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x4de1f1);
      changeColsCost(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdb8);
      HighsRayRecord::setRayRecord
                ((HighsRayRecord *)in_stack_fffffffffffffca0,
                 (HighsRayRecord *)in_stack_fffffffffffffc98);
      if ((local_d2 & 1) != 0) {
        HighsHessian::HighsHessian(in_stack_fffffffffffffcc0);
        HighsHessian::HighsHessian(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        passHessian(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        HighsHessian::~HighsHessian((HighsHessian *)in_stack_fffffffffffffca0);
        HighsHessian::~HighsHessian((HighsHessian *)in_stack_fffffffffffffca0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffdd0,"presolve",(allocator *)&stack0xfffffffffffffdcf
                );
      setOptionValue(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdcf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_258,"solve_relaxation",(allocator *)&stack0xfffffffffffffda7);
      setOptionValue(in_stack_fffffffffffffca8,(string *)in_stack_fffffffffffffca0,
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x38,0));
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffda7);
      local_260 = run(in_stack_fffffffffffffca8);
      if (local_260 != kOk) {
        local_24 = local_260;
      }
      *local_18 = *(int *)(in_RDI + 0x4a40) != -1;
      local_35 = *(byte *)(in_RDI + 0x3850) & 1;
      HighsRayRecord::~HighsRayRecord((HighsRayRecord *)0x4de569);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcb0);
    }
    if ((*local_18 & 1) == 0) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,"No dual ray found\n");
      local_24 = kOk;
    }
    else {
      sVar2 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a48));
      if (sVar2 == 0) {
        if ((local_35 & 1) == 0) {
          highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                       "No LP invertible representation to compute dual ray\n");
          local_24 = kError;
        }
        else {
          highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                       "Solving linear system to compute dual ray\n");
          this_01 = (vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffd80;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)0x4de6a0);
          iVar1 = *(int *)(in_RDI + 0x4a40);
          std::vector<double,_std::allocator<double>_>::assign
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                     (size_type)in_stack_fffffffffffffc98,(value_type_conflict1 *)0x4de6d8);
          in_stack_fffffffffffffcb0 =
               (vector<double,_std::allocator<double>_> *)(double)*(int *)(in_RDI + 0x4a44);
          this_00 = (vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffd80;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar1);
          *pvVar3 = (value_type)in_stack_fffffffffffffcb0;
          basisSolveInterface(in_stack_fffffffffffffdd8,
                              (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0,
                              (double *)in_stack_fffffffffffffdc8,
                              (HighsInt *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (HighsInt *)in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7)
          ;
          std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)this_00);
          for (local_29c = 0; local_29c < local_34; local_29c = local_29c + 1) {
            in_stack_fffffffffffffca8 = *(Highs **)(local_20 + (long)local_29c * 8);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a48),
                                (long)local_29c);
            *pvVar3 = (value_type)in_stack_fffffffffffffca8;
          }
          std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcb0);
        }
      }
      else {
        highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,"Copying known dual ray\n");
        for (local_264 = 0; local_264 < local_34; local_264 = local_264 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4a48),
                              (long)local_264);
          *(value_type *)(local_20 + (long)local_264 * 8) = *pvVar3;
        }
      }
    }
  }
  if ((local_d1 & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    if ((local_d2 & 1) != 0) {
      HighsHessian::operator=((HighsHessian *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    }
    in_stack_fffffffffffffca0 = (Highs *)&stack0xfffffffffffffd3f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffd40,"presolve",(allocator *)in_stack_fffffffffffffca0)
    ;
    setOptionValue(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd40);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd3f);
    paVar4 = &local_2e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"solve_relaxation",paVar4);
    setOptionValue(in_stack_fffffffffffffca8,(string *)in_stack_fffffffffffffca0,
                   SUB81((ulong)paVar4 >> 0x38,0));
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    *(undefined4 *)(in_RDI + 0xed8) = 0;
    *(undefined8 *)(in_RDI + 0xee0) = 0;
    *(undefined4 *)(in_RDI + 0xf18) = 0xffffffff;
    *(undefined8 *)(in_RDI + 0xf20) = 0x7ff0000000000000;
    *(undefined8 *)(in_RDI + 0xf28) = 0x7ff0000000000000;
    *(undefined8 *)(in_RDI + 0xf30) = 0x7ff0000000000000;
    *(undefined8 *)(in_RDI + 0xf38) = 0x7ff0000000000000;
    if ((*local_18 & 1) == 0) {
      *(undefined4 *)(in_RDI + 0x1244) = 0;
    }
  }
LAB_004deab3:
  local_d8 = 1;
  local_4 = local_24;
  std::__cxx11::string::~string(local_d0);
  HighsHessian::~HighsHessian((HighsHessian *)in_stack_fffffffffffffca0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcb0);
  return local_4;
}

Assistant:

HighsStatus Highs::getDualRayInterface(bool& has_dual_ray,
                                       double* dual_ray_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  // For an LP with no rows the dual ray is vacuous
  if (num_row == 0) return return_status;
  bool has_invert = ekk_instance_.status_.has_invert;
  assert(!lp.is_moved_);
  has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;

  // Declare identifiers to save column costs, integrality, any Hessian and the
  // presolve setting, and a flag to know when they should be
  // recovered
  std::vector<double> col_cost;
  HighsHessian hessian;
  bool solve_relaxation;
  std::string presolve;
  bool solve_feasibility_problem = false;
  const bool is_qp = model_.isQp();

  if (dual_ray_value != NULL) {
    // User wants a dual ray whatever
    if (!has_dual_ray || !has_invert) {
      // No dual ray is known, or no INVERT to compute it
      //
      // No point in trying to get a dual ray if the model status is
      // optimal
      if (this->model_status_ == HighsModelStatus::kOptimal) {
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Model status is optimal, so no dual ray is available\n");
        return return_status;
      }
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Solving LP to try to compute dual ray\n");
      // Save the column costs, integrality, any Hessian and the
      // presolve setting
      col_cost = lp.col_cost_;
      if (is_qp) hessian = model_.hessian_;
      this->getOptionValue("presolve", presolve);
      this->getOptionValue("solve_relaxation", solve_relaxation);
      solve_feasibility_problem = true;
      // Zero the costs, integrality and Hessian
      std::vector<double> zero_costs;
      zero_costs.assign(lp.num_col_, 0);
      // Take a copy of the primal ray record, since this will be
      // cleared by calling changeColsCost
      HighsRayRecord primal_ray_record =
          this->ekk_instance_.primal_ray_record_.getRayRecord();
      HighsStatus status =
          this->changeColsCost(0, lp.num_col_ - 1, zero_costs.data());
      assert(status == HighsStatus::kOk);
      // Reinstate the primal ray record
      this->ekk_instance_.primal_ray_record_.setRayRecord(primal_ray_record);
      if (is_qp) {
        HighsHessian zero_hessian;
        this->passHessian(zero_hessian);
      }
      this->setOptionValue("presolve", kHighsOffString);
      this->setOptionValue("solve_relaxation", true);
      HighsStatus call_status = this->run();
      if (call_status != HighsStatus::kOk) return_status = call_status;
      has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;
      has_invert = ekk_instance_.status_.has_invert;
      assert(has_invert);
    }
    if (has_dual_ray) {
      if (ekk_instance_.dual_ray_record_.value.size()) {
        // Dual ray is already computed
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Copying known dual ray\n");
        for (HighsInt iRow = 0; iRow < num_row; iRow++)
          dual_ray_value[iRow] = ekk_instance_.dual_ray_record_.value[iRow];
      } else if (has_invert) {
        // Dual ray is known and can be calculated
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Solving linear system to compute dual ray\n");
        vector<double> rhs;
        HighsInt iRow = ekk_instance_.dual_ray_record_.index;
        rhs.assign(num_row, 0);
        rhs[iRow] = ekk_instance_.dual_ray_record_.sign;
        HighsInt* dual_ray_num_nz = 0;
        basisSolveInterface(rhs, dual_ray_value, dual_ray_num_nz, NULL, true);
        // Now save the dual ray itself
        ekk_instance_.dual_ray_record_.value.resize(num_row);
        for (HighsInt iRow = 0; iRow < num_row; iRow++)
          ekk_instance_.dual_ray_record_.value[iRow] = dual_ray_value[iRow];
      } else {
        assert(!has_invert);
        // Dual ray is known but cannot be calculated
        highsLogUser(options_.log_options, HighsLogType::kError,
                     "No LP invertible representation to compute dual ray\n");
        return_status = HighsStatus::kError;
      }
    } else {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "No dual ray found\n");
      return_status = HighsStatus::kOk;
    }
  }
  if (solve_feasibility_problem) {
    // Feasibility problem has been solved, so any objective-related
    // information has been lost. Reverting the objective function via
    // Highs calls clears info_, so better to just copy the data
    // directly and set the info_ entries that are no longer valid
    lp.col_cost_ = col_cost;
    if (is_qp) model_.hessian_ = hessian;
    this->setOptionValue("presolve", presolve);
    this->setOptionValue("solve_relaxation", solve_relaxation);
    // Modify the objective-related information
    this->info_.dual_solution_status = SolutionStatus::kSolutionStatusNone;
    this->info_.objective_function_value = 0;
    this->info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
    this->info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
    this->info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
    this->info_.max_complementarity_violation =
        kHighsIllegalComplementarityViolation;
    this->info_.sum_complementarity_violations =
        kHighsIllegalComplementarityViolation;
    if (has_dual_ray) {
      assert(this->info_.num_primal_infeasibilities > 0);
      assert(this->model_status_ == HighsModelStatus::kInfeasible);
    } else {
      // If someone has tried to get a dual ray for a feasible
      // problem, then any status of the original model has been lost
      this->model_status_ = HighsModelStatus::kNotset;
    }
  }
  return return_status;
}